

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualPairwiseExpr_Test::~ExprTest_EqualPairwiseExpr_Test
          (ExprTest_EqualPairwiseExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_EqualPairwiseExpr_Test((ExprTest_EqualPairwiseExpr_Test *)0x14b1e8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, EqualPairwiseExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  NumericExpr args[] = {n0}, args2[] = {n0}, args3[] = {n1};
  EXPECT_TRUE(Equal(MakePairwise(expr::ALLDIFF, args),
                    MakePairwise(expr::ALLDIFF, args2)));
  EXPECT_FALSE(Equal(MakePairwise(expr::ALLDIFF, args),
                     MakePairwise(expr::ALLDIFF, args3)));
}